

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.c
# Opt level: O0

function * getMainFunc(vm *v)

{
  module *pmVar1;
  int iVar2;
  export_pointer paVar3;
  function *local_38;
  function *f;
  export_pointer ep;
  int i;
  module *m;
  function_index f_index;
  vm *v_local;
  
  m._4_4_ = 0xffffffff;
  pmVar1 = v->m;
  if ((pmVar1->start_sec).start_segment_count == 1) {
    m._4_4_ = *(pmVar1->start_sec).start_segment_addr;
  }
  else {
    for (ep._4_4_ = 0; ep._4_4_ < (pmVar1->export_sec).export_segment_count; ep._4_4_ = ep._4_4_ + 1
        ) {
      paVar3 = (pmVar1->export_sec).export_segment_addr + (int)ep._4_4_;
      if (((paVar3->ex_desc).tag == '\0') &&
         (iVar2 = strcmp((char *)paVar3->name,"main"), iVar2 == 0)) {
        m._4_4_ = (paVar3->ex_desc).index;
        break;
      }
    }
  }
  local_38 = (function *)0x0;
  if (m._4_4_ != 0xffffffff) {
    local_38 = (function *)(*(v->func).get_ele)(&v->func,(uint64)m._4_4_);
  }
  return local_38;
}

Assistant:

function *getMainFunc(vm *v) {
    function_index f_index = -1;
    module *m = v->m;
    if (m->start_sec.start_segment_count == 1) {
        /*获取启动段的启动函数的索引*/
        f_index = *(m->start_sec.start_segment_addr);
    } else {
        for (int i = 0; i < m->export_sec.export_segment_count; ++i) {
            export_pointer ep = m->export_sec.export_segment_addr + i;
            if (ep->ex_desc.tag == func_im_export_tag && !strcmp((const char *) ep->name, "main")) {
                f_index = ep->ex_desc.index;
                break;
            }
        }
    }
    function *f = NULL;
    if (f_index != -1)
        f = v->func.get_ele(&v->func, f_index);
    return f;
}